

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O2

void __thiscall
fmcalc::compute_item_proportions
          (fmcalc *this,
          vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
          *agg_vecs,vector<float,_std::allocator<float>_> *guls,uint level_,uint layer_,
          uint previous_layer_,bool allowzeros)

{
  long *plVar1;
  undefined8 *puVar2;
  int *piVar3;
  pointer pfVar4;
  long lVar5;
  vector<float,_std::allocator<float>_> *this_00;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  reference pvVar10;
  long lVar11;
  long lVar12;
  pointer pvVar13;
  pointer *ppfVar14;
  vector<float,_std::allocator<float>_> *pvVar15;
  int agg_vec_idx;
  iterator iter;
  float *pfVar16;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  *pvVar17;
  int *piVar18;
  long lVar19;
  float *pfVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  allocator_type local_f1;
  vector<float,_std::allocator<float>_> *local_f0;
  long local_e8;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  *local_e0;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  ulong local_a8;
  float local_9c;
  vector<int,_std::allocator<int>_> v;
  __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2> local_80;
  vector<float,_std::allocator<float>_> items_prop;
  __node_base_ptr p_Stack_40;
  long local_38;
  
  local_f0 = guls;
  local_e0 = agg_vecs;
  if (layer_ == 1) {
    v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_ =
         0;
    std::vector<float,_std::allocator<float>_>::vector
              (&items_prop,
               (long)(guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(value_type_conflict2 *)&v,
               (allocator_type *)&local_d8);
    iVar21 = level_ + 1;
    if (this->allocrule_ != 3) {
      iVar21 = (int)(((long)(agg_vecs->
                            super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(agg_vecs->
                           super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 0x18);
    }
    local_38 = (long)iVar21;
    lVar11 = 1;
    while (lVar11 < local_38) {
      pvVar13 = (agg_vecs->
                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_a8 = *(ulong *)&pvVar13[lVar11 + -1].
                            super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                            ._M_impl.super__Vector_impl_data;
      lVar12 = *(long *)&pvVar13[lVar11].
                         super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      local_9c = 0.0;
      for (lVar6 = *(long *)(local_a8 + 0x18); lVar6 != *(long *)(local_a8 + 0x20);
          lVar6 = lVar6 + 0x60) {
        local_9c = local_9c + *(float *)(lVar6 + 8);
      }
      fVar25 = 0.0;
      uVar26 = 0;
      uVar27 = 0;
      uVar28 = 0;
      local_e8 = lVar11;
      for (pfVar20 = *(float **)(lVar12 + 0x18); pfVar20 != *(float **)(lVar12 + 0x20);
          pfVar20 = pfVar20 + 0x18) {
        fVar24 = *pfVar20;
        if ((0.0 < fVar24) || (allowzeros || 0.0 < pfVar20[1])) {
          plVar1 = *(long **)(pfVar20 + 0xe);
          if (plVar1 == (long *)0x0) {
            fVar23 = 0.0;
          }
          else {
            local_b8 = (long *)CONCAT44(uVar26,fVar25);
            if (*(long *)(pfVar20 + 0x10) == 0) {
              local_80._M_ptr._0_4_ = 0;
              uStack_b0 = uVar27;
              uStack_ac = uVar28;
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&v,plVar1[1] - *plVar1 >> 2,
                         (value_type_conflict2 *)&local_80,&local_f1);
              std::
              make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                        ((vector<float,_std::allocator<float>_> *)&local_d8);
            }
            else {
              local_80._M_ptr._0_4_ = 0;
              uStack_b0 = uVar27;
              uStack_ac = uVar28;
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&v,plVar1[1] - *plVar1 >> 2,
                         (value_type_conflict2 *)&local_80,&local_f1);
              std::
              make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                        ((vector<float,_std::allocator<float>_> *)&local_d8);
            }
            std::
            __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
            operator=((__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)(pfVar20 + 0x10),
                      (__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)&local_d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &local_d8._M_impl.super__Vector_impl_data._M_finish);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      ((_Vector_base<float,_std::allocator<float>_> *)&v);
            piVar7 = (int *)**(undefined8 **)(pfVar20 + 0xe);
            fVar23 = 0.0;
            for (; piVar7 != (int *)(*(undefined8 **)(pfVar20 + 0xe))[1]; piVar7 = piVar7 + 1) {
              fVar23 = fVar23 + (guls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                super__Vector_impl_data._M_start[*piVar7];
            }
            fVar24 = *pfVar20;
            fVar25 = (float)local_b8;
            uVar26 = local_b8._4_4_;
            uVar27 = uStack_b0;
            uVar28 = uStack_ac;
          }
          pfVar20[3] = fVar23;
          fVar25 = fVar25 + fVar24;
        }
        else {
          pfVar20[3] = 0.0;
        }
      }
      pfVar16 = *(float **)(lVar12 + 0x18);
      if ((0.0 < fVar25) || (local_9c <= 0.01)) {
        lVar11 = 0;
        local_b8 = (long *)CONCAT44(uVar26,fVar25);
        uStack_b0 = uVar27;
        uStack_ac = uVar28;
        for (; pfVar16 != pfVar20; pfVar16 = pfVar16 + 0x18) {
          fVar24 = 0.0;
          if (0.0 < *pfVar16 && 0.0 < fVar25) {
            fVar24 = *pfVar16 / fVar25;
          }
          pfVar16[2] = fVar24;
          puVar2 = *(undefined8 **)(pfVar16 + 0xe);
          if (local_e8 == 1) {
            if (puVar2 != (undefined8 *)0x0) {
              piVar3 = (int *)puVar2[1];
              pfVar4 = (local_f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              fVar24 = 0.0;
              piVar7 = (int *)*puVar2;
              for (piVar18 = piVar7; piVar18 != piVar3; piVar18 = piVar18 + 1) {
                fVar24 = fVar24 + pfVar4[*piVar18];
              }
              if (0.0 < fVar24) {
                for (lVar6 = 0; piVar18 = (int *)((long)piVar7 + lVar6), piVar18 != piVar3;
                    lVar6 = lVar6 + 4) {
                  iVar21 = *piVar18;
                  if (*(long **)(pfVar16 + 0x10) != (long *)0x0) {
                    *(float *)(**(long **)(pfVar16 + 0x10) + lVar6) = pfVar4[iVar21] / pfVar16[3];
                  }
                  items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar21] = (pfVar4[iVar21] / fVar24) * pfVar16[2];
                }
              }
            }
          }
          else if (puVar2 != (undefined8 *)0x0) {
            piVar3 = (int *)puVar2[1];
            fVar24 = 0.0;
            piVar7 = (int *)*puVar2;
            for (piVar18 = piVar7; piVar18 != piVar3; piVar18 = piVar18 + 1) {
              fVar24 = fVar24 + items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start[*piVar18];
            }
            if (fVar24 <= 0.0) {
              std::
              __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
              operator=((__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                         *)(pfVar16 + 0x10),
                        (__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                         *)(*(long *)(local_a8 + 0x18) + lVar11 * 0x60 + 0x40));
              pfVar20 = *(float **)(lVar12 + 0x20);
              fVar25 = (float)local_b8;
            }
            else {
              for (lVar6 = 0; piVar18 = (int *)((long)piVar7 + lVar6), piVar18 != piVar3;
                  lVar6 = lVar6 + 4) {
                iVar21 = *piVar18;
                if (*(long **)(pfVar16 + 0x10) != (long *)0x0) {
                  *(float *)(**(long **)(pfVar16 + 0x10) + lVar6) =
                       items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar21] / fVar24;
                }
                items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start[iVar21] =
                     (items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar21] / fVar24) * pfVar16[2];
              }
            }
          }
          lVar11 = lVar11 + 1;
        }
      }
      else {
        for (; pfVar16 != pfVar20; pfVar16 = pfVar16 + 0x18) {
          puVar2 = *(undefined8 **)(pfVar16 + 0xe);
          if (puVar2 != (undefined8 *)0x0) {
            piVar3 = (int *)puVar2[1];
            for (piVar7 = (int *)*puVar2; piVar7 != piVar3; piVar7 = piVar7 + 1) {
              pfVar16[2] = pfVar16[2] +
                           items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[*piVar7];
            }
          }
        }
      }
      guls = local_f0;
      agg_vecs = local_e0;
      lVar11 = local_e8 + 1;
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&items_prop.super__Vector_base<float,_std::allocator<float>_>);
  }
  else if (previous_layer_ < layer_) {
    lVar11 = *(long *)&(agg_vecs->
                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[level_].
                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    lVar12 = (ulong)layer_ * 0x18;
    uVar8 = (*(long *)(lVar11 + 0x20) - *(long *)(lVar11 + 0x18)) / 0x60;
    uVar9 = (*(long *)(lVar11 + 8 + lVar12) - *(long *)(lVar11 + lVar12)) / 0x60;
    if (uVar8 < uVar9) {
      uVar8 = uVar9;
    }
    lVar6 = 0x40;
    while (bVar22 = uVar8 != 0, uVar8 = uVar8 - 1, bVar22) {
      lVar19 = *(long *)(lVar11 + 0x18);
      lVar5 = *(long *)(lVar11 + lVar12);
      *(undefined4 *)(lVar5 + -0x38 + lVar6) = *(undefined4 *)(lVar19 + -0x38 + lVar6);
      std::__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=((__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)(lVar5 + lVar6),
                (__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                 *)(lVar19 + lVar6));
      lVar6 = lVar6 + 0x60;
    }
  }
  else {
    lVar12 = 0x40;
    lVar11 = *(long *)&(agg_vecs->
                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[level_ - 1].
                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                       ._M_impl.super__Vector_impl_data;
    local_b8 = (long *)((ulong)previous_layer_ * 0x18 + lVar11);
    for (uVar8 = 0; lVar6 = *local_b8, uVar8 < (ulong)((local_b8[1] - lVar6) / 0x60);
        uVar8 = uVar8 + 1) {
      if (*(long *)(lVar6 + lVar12) == 0) {
        std::__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
        operator=((__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)(lVar6 + lVar12),
                  (__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                   *)(*(long *)(lVar11 + 0x18) + lVar12));
      }
      lVar12 = lVar12 + 0x60;
    }
    items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(items_prop.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::vector
              (&v,(long)(local_f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(local_f0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&items_prop,
               (allocator_type *)&local_d8);
    lVar12 = local_b8[1];
    iVar21 = 0;
    for (lVar11 = *local_b8; lVar11 != lVar12; lVar11 = lVar11 + 0x60) {
      puVar2 = *(undefined8 **)(lVar11 + 0x38);
      if (puVar2 != (undefined8 *)0x0) {
        piVar3 = (int *)puVar2[1];
        for (piVar7 = (int *)*puVar2; piVar7 != piVar3; piVar7 = piVar7 + 1) {
          *(int *)(CONCAT44(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + (long)*piVar7 * 4) = iVar21;
        }
      }
      iVar21 = iVar21 + 1;
    }
    lVar11 = (ulong)layer_ * 0x18;
    uVar8 = 0;
    pvVar17 = local_e0;
    while( true ) {
      pvVar13 = (pvVar17->
                super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = *(long *)&pvVar13[level_].
                         super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                         ._M_impl.super__Vector_impl_data;
      lVar6 = *(long *)(lVar12 + lVar11);
      if ((ulong)((*(long *)(lVar12 + 8 + lVar11) - lVar6) / 0x60) <= uVar8) break;
      puVar2 = *(undefined8 **)(lVar6 + 0x38 + uVar8 * 0x60);
      if (puVar2 != (undefined8 *)0x0) {
        piVar7 = (int *)*puVar2;
        items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)&p_Stack_40;
        items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x1;
        items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        p_Stack_40 = (__node_base_ptr)0x0;
        local_e8 = uVar8 * 0x60;
        local_a8 = uVar8;
        while( true ) {
          lVar12 = *(long *)(*(long *)&pvVar13[level_].
                                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar11);
          puVar2 = *(undefined8 **)(lVar12 + 0x38 + local_e8);
          if (piVar7 == (int *)puVar2[1]) break;
          std::__detail::
          _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&items_prop,
                   (value_type *)
                   ((long)*piVar7 * 4 +
                   CONCAT44(v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_)));
          piVar7 = piVar7 + 1;
          pvVar13 = (pvVar17->
                    super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        fVar25 = 0.0;
        ppfVar14 = &items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        while (ppfVar14 = (pointer *)*ppfVar14, ppfVar14 != (pointer *)0x0) {
          fVar25 = fVar25 + *(float *)(*local_b8 + (long)(int)*(float *)(ppfVar14 + 1) * 0x60);
        }
        lVar6 = local_e8;
        for (pvVar15 = (vector<float,_std::allocator<float>_> *)*puVar2;
            pvVar15 !=
            *(vector<float,_std::allocator<float>_> **)(*(long *)(lVar12 + 0x38 + lVar6) + 8);
            pvVar15 = (vector<float,_std::allocator<float>_> *)
                      ((long)&(pvVar15->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start + 4)) {
          if (*(long *)(lVar12 + lVar6 + 0x40) == 0) {
            local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_f0 = pvVar15;
            std::
            make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                      ((vector<float,_std::allocator<float>_> *)&local_80);
            lVar6 = local_e8;
            std::
            __shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>::
            operator=((__shared_ptr<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2>
                       *)(*(long *)(*(long *)&(pvVar17->
                                              super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start[level_].
                                              super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                              ._M_impl.super__Vector_impl_data + lVar11) + local_e8
                         + 0x40),&local_80);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_d8);
            pvVar15 = local_f0;
          }
          if (fVar25 <= 0.0) {
            local_d8._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_d8._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      (*(vector<float,_std::allocator<float>_> **)
                        (*(long *)(*(long *)&(pvVar17->
                                             super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[level_].
                                             super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                             ._M_impl.super__Vector_impl_data + lVar11) + 0x40 +
                        lVar6),(float *)&local_d8);
          }
          else {
            iVar21 = *(int *)&(pvVar15->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_start;
            lVar12 = (long)*(int *)(CONCAT44(v.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                             .super__Vector_impl_data._M_start._4_4_,
                                             v.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                             .super__Vector_impl_data._M_start._0_4_) +
                                   (long)iVar21 * 4) * 0x60;
            pfVar20 = (float *)(*local_b8 + lVar12);
            plVar1 = *(long **)(*local_b8 + 0x38 + lVar12);
            lVar12 = *plVar1;
            for (lVar19 = 0; plVar1[1] - lVar12 >> 2 != lVar19; lVar19 = lVar19 + 1) {
              if (*(int *)(lVar12 + lVar19 * 4) == iVar21) {
                if (-1 < (int)(uint)lVar19) {
                  fVar24 = *pfVar20;
                  this_00 = *(vector<float,_std::allocator<float>_> **)
                             (*(long *)(*(long *)&(pvVar17->
                                                  super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[level_]
                                                  .
                                                  super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                                  ._M_impl.super__Vector_impl_data + lVar11) + 0x40
                             + lVar6);
                  if (fVar24 <= 0.0) {
                    local_d8._M_impl.super__Vector_impl_data._M_start =
                         (pointer)((ulong)local_d8._M_impl.super__Vector_impl_data._M_start._4_4_ <<
                                  0x20);
                    std::vector<float,_std::allocator<float>_>::emplace_back<float>
                              (this_00,(float *)&local_d8);
                    pvVar17 = local_e0;
                  }
                  else {
                    local_f0 = (vector<float,_std::allocator<float>_> *)
                               CONCAT44(local_f0._4_4_,fVar24);
                    pvVar10 = std::vector<float,_std::allocator<float>_>::at
                                        (*(vector<float,_std::allocator<float>_> **)(pfVar20 + 0x10)
                                         ,(ulong)((uint)lVar19 & 0x7fffffff));
                    local_d8._M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_d8._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           (local_f0._0_4_ * *pvVar10) / fVar25);
                    std::vector<float,_std::allocator<float>_>::emplace_back<float>
                              (this_00,(float *)&local_d8);
                    pvVar17 = local_e0;
                  }
                  goto LAB_00102da5;
                }
                break;
              }
            }
            local_d8._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_d8._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
            std::vector<float,_std::allocator<float>_>::emplace_back<float>
                      (*(vector<float,_std::allocator<float>_> **)
                        (*(long *)(*(long *)&(pvVar17->
                                             super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[level_].
                                             super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                             ._M_impl.super__Vector_impl_data + lVar11) + 0x40 +
                        lVar6),(float *)&local_d8);
          }
LAB_00102da5:
          lVar12 = *(long *)(*(long *)&(pvVar17->
                                       super__Vector_base<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start[level_].
                                       super__Vector_base<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar11);
        }
        std::
        _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&items_prop);
        uVar8 = local_a8;
      }
      uVar8 = uVar8 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&v.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void fmcalc::compute_item_proportions(std::vector<std::vector<std::vector <LossRec>>> &agg_vecs, const std::vector<OASIS_FLOAT> &guls, unsigned int level_, unsigned int layer_,unsigned int previous_layer_,bool allowzeros)
{

	if (layer_ == 1) {
		std::vector<OASIS_FLOAT> items_prop (guls.size(), 0);
		int from_level = 1;
		int to_level = agg_vecs.size();
		if (allocrule_ == 3) {
			from_level = level_;
			to_level = from_level + 1;
		}
		for (int level = 1; level < to_level; level++) {
			vector <LossRec> &agg_vec = agg_vecs[level][layer_];
			vector <LossRec>& previous_agg_vec = agg_vecs[level-1][layer_];
			OASIS_FLOAT loss_total = 0;
			OASIS_FLOAT retained_loss_total = 0;
			OASIS_FLOAT previous_proportions_total = 0;
			auto p_iter = previous_agg_vec.begin();
			while (p_iter != previous_agg_vec.end()) {
				previous_proportions_total += p_iter->proportion;
				p_iter++;
			}
			auto iter = agg_vec.begin();
 			while (iter != agg_vec.end()) {
				if (iter->loss > 0 || iter->retained_loss > 0 || allowzeros == true) {
					OASIS_FLOAT total = 0;
					if (iter->item_idx) {
						if (iter->item_prop == nullptr) {
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						else {
							//(iter->item_prop)->resize((iter->item_idx)->size(), 0);
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						for (int idx : *(iter->item_idx)) {	// if this is the first level there should only be one item_idx
							total += guls[idx];
						}
					}
					iter->gul_total = total;
					loss_total += iter->loss;
					retained_loss_total += iter->retained_loss;
				}
				else {
					iter->gul_total = 0;
					retained_loss_total += iter->retained_loss;
				}
				iter++;
			}
			if (loss_total <= 0 && previous_proportions_total > 0.01) {
				// check level and layer_
				// if there is no loss_total loss just copy previous level proportions
				auto iter = agg_vec.begin();		// loop through again to work out proportion
				//auto previous_iter = previous_agg_vec.begin();		// loop through again to work out proportion
				while (iter != agg_vec.end()) {
					if (iter->item_idx) {
						for (int idx : *(iter->item_idx)) {
							//std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
							iter->proportion = iter->proportion + items_prop[idx];
						}
					}
					iter++;
				}
			}
			else {
				iter = agg_vec.begin();		// loop thru again to work out proportion
				int agg_vec_idx = 0;
				while (iter != agg_vec.end()) {
					if (iter->loss > 0 && loss_total > 0) {
						iter->proportion = iter->loss / loss_total;
					}
					else {
						iter->proportion = 0;
					}
					if (level == 1) {
						OASIS_FLOAT total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								total += guls[idx];
							}
						}
						int i = 0;
						if (total > 0) {
							for (int idx : *(iter->item_idx)) {
								if (iter->item_prop != nullptr) {
									std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
									v[i] = guls[idx] / iter->gul_total;
								}
								items_prop[idx] = (guls[idx] / total) * iter->proportion;
								i++;
							}
						}
					}
					else {
						OASIS_FLOAT prop_total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								prop_total += items_prop[idx];
							}
						}
						int i = 0;
						if (prop_total > 0) {
							if (iter->item_idx) {
								for (int idx : *(iter->item_idx)) {
									if (iter->item_prop != nullptr) {
										std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
										v[i] = items_prop[idx] / prop_total;
									}
									items_prop[idx] = (items_prop[idx] / prop_total) * iter->proportion;									
									i++;
								}
							}
						}
						else {
							if (iter->item_idx) {
								iter->item_prop = previous_agg_vec[agg_vec_idx].item_prop;
								//iter->limit_surplus = 5678;
							}
						}
					}
					iter++;
					agg_vec_idx++;
				}
			}			
		}
	}
	else {
		if (previous_layer_ < layer_) {
			vector <LossRec> &prev_agg_vec = agg_vecs[level_][1];
			vector <LossRec> &current_agg_vec = agg_vecs[level_][layer_];
			size_t iMax =  prev_agg_vec.size();
			if (current_agg_vec.size() > iMax) iMax = current_agg_vec.size();
			for (size_t i = 0; i < iMax; i++) {
				current_agg_vec[i].proportion = prev_agg_vec[i].proportion;
				current_agg_vec[i].item_prop = prev_agg_vec[i].item_prop;
			}			
		}
		else {			
			vector <LossRec> &prev_agg_vec = agg_vecs[level_ - 1][previous_layer_];
			vector <LossRec> &prev_agg_vec_base = agg_vecs[level_ - 1][1];
			for (size_t i = 0; i < prev_agg_vec.size(); i++) {
				//if (prev_agg_vec[i].item_prop->size() == 0) {
				if (prev_agg_vec[i].item_prop == nullptr) {
					//prev_agg_vec[i].loss = prev_agg_vec_base[i].loss;
					prev_agg_vec[i].item_prop = prev_agg_vec_base[i].item_prop;
				}
			}
			//

			std::vector<int> v(guls.size(), -1);
			//v.resize(guls.size(), -1);
			auto iter = prev_agg_vec.begin();
			int j = 0;

			while (iter != prev_agg_vec.end()) {
				if (iter->item_idx) {
					auto it = iter->item_idx->begin();
					while (it != iter->item_idx->end()) {
						v[*it] = j;
						it++;
					}
				}
				j++;
				iter++;
			}
			for (size_t y = 0; y < agg_vecs[level_][layer_].size(); y++) {
				if (agg_vecs[level_][layer_][y].item_idx != nullptr) {
					auto it = agg_vecs[level_][layer_][y].item_idx->begin();
					// 1 create an item id  to prev_agg_vec index
					// 2 use below loop to create a set which will then be used to iterate and get previous_gul_total
					std::unordered_set<int> s;
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						s.insert(v[*it]);
						//prev_gul_total += prev_agg_vec[*it].loss;
						it++;
					}

					OASIS_FLOAT prev_gul_total = 0;
					auto s_iter = s.begin();
					while (s_iter != s.end()) {
						prev_gul_total += prev_agg_vec[*s_iter].loss;
						s_iter++;
					}

					// agg_vecs[level_][layer_][y].loss = prev_gul_total;
					it = agg_vecs[level_][layer_][y].item_idx->begin();
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						if (agg_vecs[level_][layer_][y].item_prop == nullptr) {
							agg_vecs[level_][layer_][y].item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>());
						}
						if (prev_gul_total > 0) {
							int j = -1;
							const std::vector<int>& z = *(prev_agg_vec[v[*it]].item_idx);
							for (size_t i = 0; i < z.size(); i++) {
								if (z[i] == *it) {
									j = i;
									break;
								}
							}
							// this is recomputing the first layers proportions
							if (j > -1) {
								if (prev_agg_vec[v[*it]].loss > 0 ) agg_vecs[level_][layer_][y].item_prop->push_back(prev_agg_vec[v[*it]].loss * prev_agg_vec[v[*it]].item_prop->at(j) / prev_gul_total);
								else agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}
							else {
								agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}

						}
						else {
							agg_vecs[level_][layer_][y].item_prop->push_back(0);
						}
						it++;
					}
				}
			}
		}		
		return;

	}
}